

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O2

void Tim_ManPrintStats(Tim_Man_t *p,int nAnd2Delay)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  Vec_Int_t *p_00;
  Vec_Ptr_t *pVVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  undefined4 in_register_00000034;
  uint uVar8;
  int i;
  
  if (p != (Tim_Man_t *)0x0) {
    uVar8 = 0;
    Abc_Print((int)p,(char *)CONCAT44(in_register_00000034,nAnd2Delay));
    uVar1 = Tim_ManPiNum(p);
    uVar5 = p->nCis;
    uVar2 = Tim_ManPoNum(p);
    if (p->vBoxes != (Vec_Ptr_t *)0x0) {
      uVar8 = p->vBoxes->nSize;
    }
    printf("PI/CI = %d/%d   PO/CO = %d/%d   Box = %d   ",(ulong)uVar1,(ulong)uVar5,(ulong)uVar2,
           (ulong)(uint)p->nCos,(ulong)uVar8);
    if (nAnd2Delay != 0) {
      printf("delay(AND2) = %d",nAnd2Delay);
    }
    putchar(10);
    pVVar4 = p->vBoxes;
    if ((pVVar4 != (Vec_Ptr_t *)0x0) && (iVar7 = pVVar4->nSize, iVar7 != 0)) {
      iVar6 = 0;
      for (i = 0; i < iVar7; i = i + 1) {
        pvVar3 = Vec_PtrEntry(pVVar4,i);
        if (iVar6 <= *(int *)((long)pvVar3 + 0x10)) {
          iVar6 = *(int *)((long)pvVar3 + 0x10);
        }
        pVVar4 = p->vBoxes;
        iVar7 = pVVar4->nSize;
      }
      p_00 = Vec_IntStart(iVar6 + 1);
      pVVar4 = Vec_PtrStart(iVar6 + 1);
      iVar7 = 0;
      while( true ) {
        if (p->vBoxes->nSize <= iVar7) {
          uVar5 = p_00->nSize;
          if ((int)uVar5 < 1) {
            uVar5 = 0;
          }
          for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
            uVar1 = Vec_IntEntry(p_00,uVar8);
            if (uVar1 != 0) {
              pvVar3 = Vec_PtrEntry(pVVar4,uVar8);
              printf("    Box %4d      ",(ulong)uVar8);
              printf("Num = %4d   ",(ulong)uVar1);
              printf("Ins = %4d   ",(ulong)*(uint *)((long)pvVar3 + 8));
              printf("Outs = %4d",(ulong)*(uint *)((long)pvVar3 + 0xc));
              putchar(10);
            }
          }
          free(p_00->pArray);
          free(p_00);
          Vec_PtrFree(pVVar4);
          return;
        }
        pvVar3 = Vec_PtrEntry(p->vBoxes,iVar7);
        iVar6 = *(int *)((long)pvVar3 + 0x10);
        if (((long)iVar6 < 0) || (p_00->nSize <= iVar6)) break;
        p_00->pArray[iVar6] = p_00->pArray[iVar6] + 1;
        Vec_PtrWriteEntry(pVVar4,*(int *)((long)pvVar3 + 0x10),pvVar3);
        iVar7 = iVar7 + 1;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
    }
  }
  return;
}

Assistant:

void Tim_ManPrintStats( Tim_Man_t * p, int nAnd2Delay )
{
    Tim_Box_t * pBox;
    Vec_Int_t * vCounts;
    Vec_Ptr_t * vBoxes;
    int i, Count, IdMax;
    if ( p == NULL )
        return;
    Abc_Print( 1, "Hierarchy      :  " );
    printf( "PI/CI = %d/%d   PO/CO = %d/%d   Box = %d   ", 
        Tim_ManPiNum(p), Tim_ManCiNum(p), 
        Tim_ManPoNum(p), Tim_ManCoNum(p), 
        Tim_ManBoxNum(p) );
    if ( nAnd2Delay )
        printf( "delay(AND2) = %d", nAnd2Delay );
    printf( "\n" );
    if ( Tim_ManBoxNum(p) == 0 )
        return;
    IdMax = 0;
    Tim_ManForEachBox( p, pBox, i )
        IdMax = Abc_MaxInt( IdMax, pBox->iDelayTable );
    vCounts = Vec_IntStart( IdMax+1 );
    vBoxes  = Vec_PtrStart( IdMax+1 );
    Tim_ManForEachBox( p, pBox, i )
    {
        Vec_IntAddToEntry( vCounts, pBox->iDelayTable, 1 );
        Vec_PtrWriteEntry( vBoxes, pBox->iDelayTable, pBox );
    }
    // print statistics about boxes
    Vec_IntForEachEntry( vCounts, Count, i )
    {
        if ( Count == 0 ) continue;
        pBox = (Tim_Box_t *)Vec_PtrEntry( vBoxes, i );
        printf( "    Box %4d      ", i );
        printf( "Num = %4d   ", Count );
        printf( "Ins = %4d   ", pBox->nInputs );
        printf( "Outs = %4d",   pBox->nOutputs );
        printf( "\n" );
    }
    Vec_IntFree( vCounts );
    Vec_PtrFree( vBoxes );
}